

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qintc.cc
# Opt level: O1

int main(void)

{
  longlong *plVar1;
  ostream *poVar2;
  unsigned_long *in_RCX;
  longlong *b;
  unsigned_long_long *b_00;
  char max_sc;
  longlong min_ll;
  unsigned_long_long max_ull;
  longlong max_ll;
  uint64_t ul2;
  uint64_t ul1;
  unsigned_long_long local_70;
  int local_64;
  char local_5e [6];
  longlong local_58 [3];
  ulong local_40;
  undefined8 local_38;
  
  local_38 = 0x10000000000;
  local_40 = 0x3039;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"QIntC::to_int<int32_t>(i1)",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,-0x44bf19b3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  std::ostream::operator<<((ostream *)poVar2,-0x44bf19b3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," PASSED",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"QIntC::to_uint<uint32_t>(u1)",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," PASSED",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  QIntC::IntConverter<unsigned_int,_int,_false,_true>::error(0xbb40e64d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"QIntC::to_int<uint32_t>(u1)",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  std::ostream::operator<<((ostream *)poVar2,-0x44bf19b3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," FAILED",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  QIntC::IntConverter<int,_unsigned_int,_true,_false>::error(-0x44bf19b3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"QIntC::to_uint<int32_t>(i1)",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,-0x44bf19b3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," FAILED",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  try_convert_real<unsigned_long,int>
            ("QIntC::to_int<uint64_t>(ul1)",false,(_func_int_unsigned_long_ptr *)&local_38,in_RCX);
  try_convert_real<unsigned_long,int>
            ("QIntC::to_int<uint64_t>(ul2)",true,(_func_int_unsigned_long_ptr *)&local_40,in_RCX);
  if (local_40 >> 0x20 != 0) {
    QIntC::IntConverter<unsigned_long,_unsigned_int,_false,_false>::error(local_40);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"QIntC::to_uint<uint64_t>(ul2)",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," PASSED",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"QIntC::to_offset<uint32_t>(u1)",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  std::ostream::_M_insert<long_long>((longlong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," PASSED",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"QIntC::to_offset<int32_t>(i1)",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,-0x44bf19b3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  std::ostream::_M_insert<long_long>((longlong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," PASSED",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  QIntC::IntConverter<int,_unsigned_long_long,_true,_false>::error(-0x44bf19b3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"QIntC::to_ulonglong<int32_t>(i1)",0x20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,-0x44bf19b3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," FAILED",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"QIntC::to_char<int32_t>(i2)",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x51);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  local_5e[4] = 0x51;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_5e + 4,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," PASSED",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"QIntC::to_uchar<int32_t>(i2)",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x51);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  local_5e[5] = 0x51;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_5e + 5,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," PASSED",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  QIntC::IntConverter<signed_char,_unsigned_char,_true,_false>::error(-9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"QIntC::to_uchar<signed char>(c1)",0x20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
  local_5e[1] = 0xf7;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_5e + 1,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  local_5e[1] = 0xf7;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_5e + 1,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," FAILED",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"QIntC::to_uchar<char>(c2)",0x19);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
  local_5e[2] = 0x57;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_5e + 2,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  local_5e[2] = 0x57;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_5e + 2,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," PASSED",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"QIntC::to_char<char>(c2)",0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
  local_5e[3] = 0x57;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_5e + 3,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  local_5e[3] = 0x57;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_5e + 3,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," PASSED",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  plVar1 = local_58 + 2;
  local_58[2] = 0x7fffffffffffffff;
  local_58[1] = 0xffffffffffffffff;
  b = local_58;
  local_58[0] = -0x8000000000000000;
  local_5e[0] = '\x7f';
  local_70._0_4_ = 1;
  local_64 = 2;
  try_range_check_real<int>("1 + 2",SUB81(&local_70,0),&local_64,(int *)b);
  local_70._0_4_ = 0xffffffff;
  local_64 = 2;
  try_range_check_real<int>("-1 + 2",SUB81(&local_70,0),&local_64,(int *)b);
  local_70 = CONCAT44(local_70._4_4_,0xffffff9c);
  local_64 = -200;
  try_range_check_real<int>("-100 + -200",SUB81(&local_70,0),&local_64,(int *)b);
  local_70 = 0;
  try_range_check_real<long_long>("max_ll + 0LL",true,plVar1,(longlong *)&local_70);
  local_70 = 1;
  try_range_check_real<long_long>("max_ll + 1LL",false,plVar1,(longlong *)&local_70);
  local_70 = 0;
  try_range_check_real<long_long>("max_ll + 0LL",true,plVar1,(longlong *)&local_70);
  local_70 = 1;
  try_range_check_real<long_long>("max_ll + 1LL",false,plVar1,(longlong *)&local_70);
  local_70 = 0;
  try_range_check_real<unsigned_long_long>
            ("max_ull + 0ULL",true,(unsigned_long_long *)(local_58 + 1),&local_70);
  local_70 = 1;
  try_range_check_real<unsigned_long_long>
            ("max_ull + 1ULL",false,(unsigned_long_long *)(local_58 + 1),&local_70);
  local_70 = 0;
  try_range_check_real<long_long>("min_ll + 0LL",true,local_58,(longlong *)&local_70);
  local_70 = 0xffffffffffffffff;
  b_00 = &local_70;
  try_range_check_real<long_long>("min_ll + -1LL",false,local_58,(longlong *)b_00);
  QIntC::range_check_error<signed_char>(local_5e,local_5e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"max_sc + max_sc",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": okay",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," FAILED",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  local_70 = CONCAT71(local_70._1_7_,0x21);
  local_64 = CONCAT31(local_64._1_3_,0x23);
  QIntC::range_check_error<char>((char *)&local_70,(char *)&local_64);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'!\' + \'#\'",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": okay",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," PASSED",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  local_70._0_4_ = 1;
  local_64 = 2;
  try_range_check_subtract_real<int>("1 - 2",SUB81(&local_70,0),&local_64,(int *)b_00);
  local_70._0_4_ = 0xffffffff;
  local_64 = -2;
  try_range_check_subtract_real<int>("-1 - -2",SUB81(&local_70,0),&local_64,(int *)b_00);
  local_70._0_4_ = 1;
  local_64 = 10;
  try_range_check_subtract_real<int>("1 - 10",SUB81(&local_70,0),&local_64,(int *)b_00);
  local_70 = CONCAT44(local_70._4_4_,0xffffffff);
  local_64 = -10;
  try_range_check_subtract_real<int>("-1 - -10",SUB81(&local_70,0),&local_64,(int *)b_00);
  local_70 = 0;
  try_range_check_subtract_real<long_long>("0LL - min_ll",false,(longlong *)&local_70,local_58);
  local_70 = 1;
  try_range_check_subtract_real<long_long>("1LL - min_ll",false,(longlong *)&local_70,local_58);
  local_70 = 0;
  plVar1 = local_58 + 2;
  try_range_check_subtract_real<long_long>("0LL - max_ll",true,(longlong *)&local_70,plVar1);
  local_70 = 0xffffffffffffffff;
  try_range_check_subtract_real<long_long>("-1LL - max_ll",true,(longlong *)&local_70,plVar1);
  local_70 = 0xfffffffffffffffe;
  try_range_check_subtract_real<long_long>("-2LL - max_ll",false,(longlong *)&local_70,plVar1);
  return 0;
}

Assistant:

int
main()
{
    uint32_t u1 = 3141592653U;                  // Too big for signed type
    int32_t i1 = -1153374643;                   // Same bit pattern as u1
    uint64_t ul1 = 1099511627776LL;             // Too big for 32-bit
    uint64_t ul2 = 12345;                       // Fits into 32-bit
    int32_t i2 = 81;                            // Fits in char and uchar
    auto c1 = static_cast<signed char>('\xf7'); // Signed value when char
    char c2 = 'W';                              // char; may be signed or unsigned

    // Verify i1 and u1 have same bit pattern
    assert(static_cast<uint32_t>(i1) == u1);
    // Verify that we can unsafely convert between signed and unsigned char
    assert(c1 == static_cast<signed char>(static_cast<unsigned char>(c1)));

    try_convert(true, QIntC::to_int<int32_t>, i1);
    try_convert(true, QIntC::to_uint<uint32_t>, u1);
    try_convert(false, QIntC::to_int<uint32_t>, u1);
    try_convert(false, QIntC::to_uint<int32_t>, i1);
    try_convert(false, QIntC::to_int<uint64_t>, ul1);
    try_convert(true, QIntC::to_int<uint64_t>, ul2);
    try_convert(true, QIntC::to_uint<uint64_t>, ul2);
    try_convert(true, QIntC::to_offset<uint32_t>, u1);
    try_convert(true, QIntC::to_offset<int32_t>, i1);
    try_convert(false, QIntC::to_ulonglong<int32_t>, i1);
    try_convert(true, QIntC::to_char<int32_t>, i2);
    try_convert(true, QIntC::to_uchar<int32_t>, i2);
    try_convert(false, QIntC::to_uchar<signed char>, c1);
    try_convert(true, QIntC::to_uchar<char>, c2);
    try_convert(true, QIntC::to_char<char>, c2);

    auto constexpr max_ll = std::numeric_limits<long long>::max();
    auto constexpr max_ull = std::numeric_limits<unsigned long long>::max();
    auto constexpr min_ll = std::numeric_limits<long long>::min();
    auto constexpr max_sc = std::numeric_limits<signed char>::max();
    try_range_check(true, 1, 2);
    try_range_check(true, -1, 2);
    try_range_check(true, -100, -200);
    try_range_check(true, max_ll, 0LL);
    try_range_check(false, max_ll, 1LL);
    try_range_check(true, max_ll, 0LL);
    try_range_check(false, max_ll, 1LL);
    try_range_check(true, max_ull, 0ULL);
    try_range_check(false, max_ull, 1ULL);
    try_range_check(true, min_ll, 0LL);
    try_range_check(false, min_ll, -1LL);
    try_range_check(false, max_sc, max_sc);
    try_range_check(true, '!', '#');
    try_range_check_subtract(true, 1, 2);
    try_range_check_subtract(true, -1, -2);
    try_range_check_subtract(true, 1, 10);
    try_range_check_subtract(true, -1, -10);
    try_range_check_subtract(false, 0LL, min_ll);
    try_range_check_subtract(false, 1LL, min_ll);
    try_range_check_subtract(true, 0LL, max_ll);
    try_range_check_subtract(true, -1LL, max_ll);
    try_range_check_subtract(false, -2LL, max_ll);
    return 0;
}